

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NewFrame(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  ImGuiKeyModFlags IVar3;
  ImGuiContextHook *pIVar4;
  ImGuiViewportP **ppIVar5;
  ImGuiWindow *pIVar6;
  ImGuiWindow **ppIVar7;
  float *pfVar8;
  ImGuiTableTempData *pIVar9;
  float fVar10;
  undefined1 auVar11 [64];
  undefined1 auVar13 [56];
  undefined1 auVar12 [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [56];
  undefined1 auVar15 [64];
  ImRect IVar17;
  ImVec4 IVar18;
  int i_3;
  int i_2;
  ImGuiWindow *window;
  int i_1;
  float memory_compact_start_time;
  int i;
  ImGuiViewportP *viewport;
  int n_2;
  int n_1;
  ImRect virtual_space;
  int n;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000374;
  bool *in_stack_00000378;
  char *in_stack_00000380;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float fVar19;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ImGuiTable *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar20;
  int local_78;
  int local_74;
  int local_64;
  ImVec2 local_5c;
  int local_54;
  ImGuiViewportP *local_50;
  int local_44;
  undefined8 local_40;
  undefined8 local_38;
  ImRect local_30;
  int local_20;
  ImRect local_1c;
  int local_c;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  local_c = (GImGui->Hooks).Size;
  while (local_c = local_c + -1, -1 < local_c) {
    pIVar4 = ImVector<ImGuiContextHook>::operator[](&local_8->Hooks,local_c);
    if (*(int *)(pIVar4 + 4) == 7) {
      in_stack_ffffffffffffff70 = (ImGuiTable *)&local_8->Hooks;
      ImVector<ImGuiContextHook>::operator[](&local_8->Hooks,local_c);
      ImVector<ImGuiContextHook>::erase
                ((ImVector<ImGuiContextHook> *)in_stack_ffffffffffffff70,
                 (ImGuiContextHook *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
  }
  CallContextHooks((ImGuiContext *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (ImGuiContextHookType)in_stack_ffffffffffffff7c);
  ErrorCheckNewFrameSanityChecks();
  UpdateSettings();
  local_8->Time = (double)(local_8->IO).DeltaTime + local_8->Time;
  local_8->WithinFrameScope = true;
  local_8->FrameCount = local_8->FrameCount + 1;
  local_8->TooltipOverrideCount = 0;
  local_8->WindowsActiveCount = 0;
  ImVector<unsigned_int>::resize
            ((ImVector<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
             ,in_stack_ffffffffffffff5c);
  local_8->FramerateSecPerFrameAccum =
       ((local_8->IO).DeltaTime - local_8->FramerateSecPerFrame[local_8->FramerateSecPerFrameIdx]) +
       local_8->FramerateSecPerFrameAccum;
  local_8->FramerateSecPerFrame[local_8->FramerateSecPerFrameIdx] = (local_8->IO).DeltaTime;
  local_8->FramerateSecPerFrameIdx = (local_8->FramerateSecPerFrameIdx + 1) % 0x78;
  iVar2 = ImMin<int>(local_8->FramerateSecPerFrameCount + 1,0x78);
  local_8->FramerateSecPerFrameCount = iVar2;
  if (local_8->FramerateSecPerFrameAccum <= 0.0) {
    fVar10 = 3.4028235e+38;
  }
  else {
    fVar10 = 1.0 / (local_8->FramerateSecPerFrameAccum / (float)local_8->FramerateSecPerFrameCount);
  }
  (local_8->IO).Framerate = fVar10;
  UpdateViewportsNewFrame();
  ((local_8->IO).Fonts)->Locked = true;
  GetDefaultFont();
  SetCurrentFont((ImFont *)in_stack_ffffffffffffff70);
  auVar14 = ZEXT464(0x7f7fffff);
  auVar11 = ZEXT1664(auVar14._0_16_);
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffff70,fVar10,in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
  local_20 = 0;
  while( true ) {
    auVar16 = auVar14._8_56_;
    auVar13 = auVar11._8_56_;
    if ((local_8->Viewports).Size <= local_20) break;
    ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_20);
    IVar17 = ImGuiViewportP::GetMainRect((ImGuiViewportP *)0x54aa08);
    auVar14._0_8_ = IVar17.Max;
    auVar14._8_56_ = auVar16;
    auVar11._0_8_ = IVar17.Min;
    auVar11._8_56_ = auVar13;
    local_30.Min = (ImVec2)vmovlpd_avx(auVar11._0_16_);
    local_30.Max = (ImVec2)vmovlpd_avx(auVar14._0_16_);
    ImRect::Add(&local_1c,&local_30);
    local_20 = local_20 + 1;
  }
  IVar18 = ImRect::ToVec4((ImRect *)0x54aa49);
  auVar15._0_8_ = IVar18._8_8_;
  auVar15._8_56_ = auVar16;
  auVar12._0_8_ = IVar18._0_8_;
  auVar12._8_56_ = auVar13;
  local_40 = vmovlpd_avx(auVar12._0_16_);
  local_38 = vmovlpd_avx(auVar15._0_16_);
  (local_8->DrawListSharedData).ClipRectFullscreen.x = (float)(int)local_40;
  (local_8->DrawListSharedData).ClipRectFullscreen.y = (float)(int)((ulong)local_40 >> 0x20);
  (local_8->DrawListSharedData).ClipRectFullscreen.z = (float)(int)local_38;
  (local_8->DrawListSharedData).ClipRectFullscreen.w = (float)(int)((ulong)local_38 >> 0x20);
  (local_8->DrawListSharedData).CurveTessellationTol = (local_8->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError
            ((ImDrawListSharedData *)in_stack_ffffffffffffff70,fVar10);
  (local_8->DrawListSharedData).InitialFlags = 0;
  if (((local_8->Style).AntiAliasedLines & 1U) != 0) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 1;
  }
  if ((((local_8->Style).AntiAliasedLinesUseTex & 1U) != 0) &&
     ((local_8->Font->ContainerAtlas->Flags & 4U) == 0)) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 2;
  }
  if (((local_8->Style).AntiAliasedFill & 1U) != 0) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 4;
  }
  if (((local_8->IO).BackendFlags & 8U) != 0) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 8;
  }
  for (local_44 = 0; local_44 < (local_8->Viewports).Size; local_44 = local_44 + 1) {
    ppIVar5 = ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_44);
    local_50 = *ppIVar5;
    ImDrawData::Clear((ImDrawData *)0x54abd4);
  }
  if (((local_8->DragDropActive & 1U) != 0) &&
     ((local_8->DragDropPayload).SourceId == local_8->ActiveId)) {
    KeepAliveID((local_8->DragDropPayload).SourceId);
  }
  if (local_8->HoveredIdPreviousFrame == 0) {
    local_8->HoveredIdTimer = 0.0;
  }
  if ((local_8->HoveredIdPreviousFrame == 0) ||
     ((local_8->HoveredId != 0 && (local_8->ActiveId == local_8->HoveredId)))) {
    local_8->HoveredIdNotActiveTimer = 0.0;
  }
  if (local_8->HoveredId != 0) {
    local_8->HoveredIdTimer = (local_8->IO).DeltaTime + local_8->HoveredIdTimer;
  }
  if ((local_8->HoveredId != 0) && (local_8->ActiveId != local_8->HoveredId)) {
    local_8->HoveredIdNotActiveTimer = (local_8->IO).DeltaTime + local_8->HoveredIdNotActiveTimer;
  }
  local_8->HoveredIdPreviousFrame = local_8->HoveredId;
  local_8->HoveredIdPreviousFrameUsingMouseWheel = (bool)(local_8->HoveredIdUsingMouseWheel & 1);
  local_8->HoveredId = 0;
  local_8->HoveredIdAllowOverlap = false;
  local_8->HoveredIdUsingMouseWheel = false;
  local_8->HoveredIdDisabled = false;
  if (((local_8->ActiveIdIsAlive != local_8->ActiveId) &&
      (local_8->ActiveIdPreviousFrame == local_8->ActiveId)) && (local_8->ActiveId != 0)) {
    ClearActiveID();
  }
  if (local_8->ActiveId != 0) {
    local_8->ActiveIdTimer = (local_8->IO).DeltaTime + local_8->ActiveIdTimer;
  }
  local_8->LastActiveIdTimer = (local_8->IO).DeltaTime + local_8->LastActiveIdTimer;
  local_8->ActiveIdPreviousFrame = local_8->ActiveId;
  local_8->ActiveIdPreviousFrameWindow = local_8->ActiveIdWindow;
  local_8->ActiveIdPreviousFrameHasBeenEditedBefore =
       (bool)(local_8->ActiveIdHasBeenEditedBefore & 1);
  local_8->ActiveIdIsAlive = 0;
  local_8->ActiveIdHasBeenEditedThisFrame = false;
  local_8->ActiveIdPreviousFrameIsAlive = false;
  local_8->ActiveIdIsJustActivated = false;
  if ((local_8->TempInputId != 0) && (local_8->ActiveId != local_8->TempInputId)) {
    local_8->TempInputId = 0;
  }
  if (local_8->ActiveId == 0) {
    local_8->ActiveIdUsingNavDirMask = 0;
    local_8->ActiveIdUsingNavInputMask = 0;
    local_8->ActiveIdUsingKeyInputMask = 0;
  }
  local_8->DragDropAcceptIdPrev = local_8->DragDropAcceptIdCurr;
  local_8->DragDropAcceptIdCurr = 0;
  local_8->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  local_8->DragDropWithinSource = false;
  local_8->DragDropWithinTarget = false;
  local_8->DragDropHoldJustPressedId = 0;
  if (((local_8->IO).AppFocusLost & 1U) != 0) {
    ImGuiIO::ClearInputKeys
              ((ImGuiIO *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    (local_8->IO).AppFocusLost = false;
  }
  IVar3 = GetMergedKeyModFlags();
  (local_8->IO).KeyMods = IVar3;
  memcpy((local_8->IO).KeysDownDurationPrev,(local_8->IO).KeysDownDuration,0x800);
  for (local_54 = 0; local_54 < 0x200; local_54 = local_54 + 1) {
    if (((local_8->IO).KeysDown[local_54] & 1U) == 0) {
      in_stack_ffffffffffffff64 = -1.0;
    }
    else if (0.0 <= (local_8->IO).KeysDownDuration[local_54]) {
      in_stack_ffffffffffffff64 = (local_8->IO).KeysDownDuration[local_54] + (local_8->IO).DeltaTime
      ;
    }
    else {
      in_stack_ffffffffffffff64 = 0.0;
    }
    (local_8->IO).KeysDownDuration[local_54] = in_stack_ffffffffffffff64;
  }
  NavUpdate();
  UpdateMouseInputs();
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar6 = GetTopMostPopupModal();
  if ((pIVar6 != (ImGuiWindow *)0x0) ||
     ((local_8->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < local_8->NavWindowingHighlightAlpha)))) {
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40c00000),0),ZEXT416((uint)(local_8->IO).DeltaTime),
                             ZEXT416((uint)local_8->DimBgRatio));
    fVar10 = ImMin<float>(auVar1._0_4_,1.0);
    local_8->DimBgRatio = fVar10;
  }
  else {
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41200000),0),ZEXT416((uint)-(local_8->IO).DeltaTime),
                             ZEXT416((uint)local_8->DimBgRatio));
    fVar10 = ImMax<float>(auVar1._0_4_,0.0);
    local_8->DimBgRatio = fVar10;
  }
  local_8->MouseCursor = 0;
  local_8->WantTextInputNextFrame = -1;
  local_8->WantCaptureKeyboardNextFrame = -1;
  local_8->WantCaptureMouseNextFrame = -1;
  ImVec2::ImVec2(&local_5c,1.0,1.0);
  local_8->PlatformImePos = local_5c;
  UpdateMouseWheel();
  if (((local_8->GcCompactAll & 1U) != 0) || ((local_8->IO).ConfigMemoryCompactTimer < 0.0)) {
    fVar10 = 3.4028235e+38;
  }
  else {
    fVar10 = (float)local_8->Time - (local_8->IO).ConfigMemoryCompactTimer;
  }
  fVar19 = fVar10;
  for (local_64 = 0; local_64 != (local_8->Windows).Size; local_64 = local_64 + 1) {
    ppIVar7 = ImVector<ImGuiWindow_*>::operator[](&local_8->Windows,local_64);
    pIVar6 = *ppIVar7;
    pIVar6->WasActive = (bool)(pIVar6->Active & 1);
    pIVar6->BeginCount = 0;
    pIVar6->Active = false;
    pIVar6->WriteAccessed = false;
    if ((((pIVar6->WasActive & 1U) == 0) && ((pIVar6->MemoryCompacted & 1U) == 0)) &&
       (pIVar6->LastTimeActive < fVar10)) {
      GcCompactTransientWindowBuffers((ImGuiWindow *)0x54b3a8);
    }
  }
  for (local_74 = 0; local_74 < (local_8->TablesLastTimeActive).Size; local_74 = local_74 + 1) {
    pfVar8 = ImVector<float>::operator[](&local_8->TablesLastTimeActive,local_74);
    if ((0.0 <= *pfVar8) &&
       (pfVar8 = ImVector<float>::operator[](&local_8->TablesLastTimeActive,local_74),
       *pfVar8 < fVar10)) {
      ImPool<ImGuiTable>::GetByIndex
                ((ImPool<ImGuiTable> *)CONCAT44(in_stack_ffffffffffffff64,fVar19),
                 in_stack_ffffffffffffff5c);
      TableGcCompactTransientBuffers(in_stack_ffffffffffffff70);
    }
  }
  for (local_78 = 0; local_78 < (local_8->TablesTempData).Size; local_78 = local_78 + 1) {
    pIVar9 = ImVector<ImGuiTableTempData>::operator[](&local_8->TablesTempData,local_78);
    if ((0.0 <= pIVar9->LastTimeActive) &&
       (pIVar9 = ImVector<ImGuiTableTempData>::operator[](&local_8->TablesTempData,local_78),
       pIVar9->LastTimeActive < fVar10)) {
      ImVector<ImGuiTableTempData>::operator[](&local_8->TablesTempData,local_78);
      TableGcCompactTransientBuffers((ImGuiTableTempData *)0x54b4ea);
    }
  }
  if ((local_8->GcCompactAll & 1U) != 0) {
    GcCompactTransientMiscBuffers();
  }
  local_8->GcCompactAll = false;
  if ((local_8->NavWindow != (ImGuiWindow *)0x0) && ((local_8->NavWindow->WasActive & 1U) == 0)) {
    FocusTopMostWindowUnderOne
              ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  ImVector<ImGuiWindowStackData>::resize
            ((ImVector<ImGuiWindowStackData> *)CONCAT44(in_stack_ffffffffffffff64,fVar19),
             in_stack_ffffffffffffff5c);
  ImVector<ImGuiPopupData>::resize
            ((ImVector<ImGuiPopupData> *)CONCAT44(in_stack_ffffffffffffff64,fVar19),
             in_stack_ffffffffffffff5c);
  ImVector<int>::resize
            ((ImVector<int> *)CONCAT44(in_stack_ffffffffffffff64,fVar19),in_stack_ffffffffffffff5c);
  uVar20 = 0;
  ImVector<int>::push_back
            ((ImVector<int> *)CONCAT44(in_stack_ffffffffffffff64,fVar19),
             (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  ImVector<ImGuiGroupData>::resize
            ((ImVector<ImGuiGroupData> *)CONCAT44(in_stack_ffffffffffffff64,fVar19),
             in_stack_ffffffffffffff5c);
  UpdateDebugToolItemPicker();
  UpdateDebugToolStackQueries();
  local_8->WithinFrameScopeWithImplicitWindow = true;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff7c,400.0,400.0);
  SetNextWindowSize((ImVec2 *)&stack0xffffffffffffff7c,4);
  Begin(in_stack_00000380,in_stack_00000378,in_stack_00000374);
  CallContextHooks((ImGuiContext *)CONCAT44(uVar20,in_stack_ffffffffffffff80),
                   (ImGuiContextHookType)in_stack_ffffffffffffff7c);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Clear buttons state when focus is lost
    // (this is useful so e.g. releasing Alt after focus loss on Alt-Tab doesn't trigger the Alt menu toggle)
    if (g.IO.AppFocusLost)
    {
        g.IO.ClearInputKeys();
        g.IO.AppFocusLost = false;
    }

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}